

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this,
          initializer_list<pstore::command_line::literal> init)

{
  small_vector(this);
  reserve(this,init._M_len);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<pstore::command_line::literal_const*,std::back_insert_iterator<pstore::small_vector<pstore::command_line::literal,3ul>>>
            (init._M_array,init._M_array + init._M_len,
             (back_insert_iterator<pstore::small_vector<pstore::command_line::literal,_3UL>_>)this);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }